

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

Vec_Ptr_t * Llb_NonlinBuildBdds(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,DdManager *dd)

{
  ulong uVar1;
  ulong uVar2;
  DdNode *pDVar3;
  void *pvVar4;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  int *piVar5;
  int iVar6;
  int i;
  
  pDVar3 = Cudd_ReadOne(dd);
  (p->pConst1->field_5).pData = pDVar3;
  for (iVar6 = 0; iVar6 < vLower->nSize; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(vLower,iVar6);
    pDVar3 = Cudd_bddIthVar(dd,*(int *)((long)pvVar4 + 0x24));
    *(DdNode **)((long)pvVar4 + 0x28) = pDVar3;
  }
  p_00 = Llb_NonlinCutNodes(p,vLower,vUpper);
  for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(p_00,iVar6);
    pDVar3 = Cudd_bddAnd(dd,(DdNode *)
                            ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^
                            *(ulong *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x28)),
                         (DdNode *)
                         ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^
                         *(ulong *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x28)))
    ;
    *(DdNode **)((long)pvVar4 + 0x28) = pDVar3;
    if (pDVar3 == (DdNode *)0x0) {
      for (i = 0; iVar6 != i; i = i + 1) {
        pvVar4 = Vec_PtrEntry(p_00,i);
        if (*(DdNode **)((long)pvVar4 + 0x28) != (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + 0x28));
        }
      }
      Vec_PtrFree(p_00);
      return (Vec_Ptr_t *)0x0;
    }
    Cudd_Ref(pDVar3);
  }
  p_01 = Vec_PtrAlloc(100);
  iVar6 = 0;
  do {
    if (vUpper->nSize <= iVar6) {
      for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
        pvVar4 = Vec_PtrEntry(p_00,iVar6);
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + 0x28));
      }
      Vec_PtrFree(p_00);
      return p_01;
    }
    piVar5 = (int *)Vec_PtrEntry(vUpper,iVar6);
    if (((uint)*(undefined8 *)(piVar5 + 6) & 7) - 7 < 0xfffffffe) {
      if ((((uint)*(undefined8 *)(piVar5 + 6) & 7) != 3) || (*piVar5 < p->nTruePos)) {
        __assert_fail("Saig_ObjIsLi(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                      ,0x244,
                      "Vec_Ptr_t *Llb_NonlinBuildBdds(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, DdManager *)"
                     );
      }
      uVar1 = *(ulong *)(piVar5 + 2);
      uVar2 = *(ulong *)((uVar1 & 0xfffffffffffffffe) + 0x28);
      pDVar3 = Cudd_bddIthVar(dd,piVar5[9]);
      pDVar3 = Cudd_bddXnor(dd,pDVar3,(DdNode *)((uint)uVar1 & 1 ^ uVar2));
    }
    else {
      pDVar3 = Cudd_bddIthVar(dd,piVar5[9]);
      pDVar3 = Cudd_bddXnor(dd,pDVar3,*(DdNode **)(piVar5 + 10));
    }
    Cudd_Ref(pDVar3);
    Vec_PtrPush(p_01,pDVar3);
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_NonlinBuildBdds( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, DdManager * dd )
{
    Vec_Ptr_t * vNodes, * vResult;
    Aig_Obj_t * pObj;
    DdNode * bBdd0, * bBdd1, * bProd;
    int i, k;

    Aig_ManConst1(p)->pData = Cudd_ReadOne( dd );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );

    vNodes = Llb_NonlinCutNodes( p, vLower, vUpper );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeOut );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }

    vResult = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), (DdNode *)pObj->pData );  Cudd_Ref( bProd );
        }
        else
        {
            assert( Saig_ObjIsLi(p, pObj) );
            bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
            bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), bBdd0 );                  Cudd_Ref( bProd );
        }
        Vec_PtrPush( vResult, bProd );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );

    Vec_PtrFree( vNodes );
    return vResult;
}